

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatasetBuilder.cpp
# Opt level: O0

void __thiscall
DatasetBuilder::DatasetBuilder
          (DatasetBuilder *this,BuilderType builder_type,
          vector<IndexType,_std::allocator<IndexType>_> *index_types)

{
  vector<IndexType,_std::allocator<IndexType>_> *in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  DatasetBuilder *in_stack_00000010;
  vector<IndexType,_std::allocator<IndexType>_> *in_stack_ffffffffffffffa8;
  
  *in_RDI = in_ESI;
  std::vector<IndexType,_std::allocator<IndexType>_>::vector(in_RDX,in_stack_ffffffffffffffa8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1b858f);
  std::
  vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
  ::vector((vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
            *)0x1b85a2);
  clear(in_stack_00000010);
  return;
}

Assistant:

DatasetBuilder::DatasetBuilder(BuilderType builder_type,
                               std::vector<IndexType> index_types)
    : builder_type(builder_type), index_types(std::move(index_types)) {
    clear();
}